

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

void h2o_config_dispose_pathconf(h2o_pathconf_t *pathconf)

{
  st_h2o_handler_t *__ptr;
  st_h2o_filter_t *__ptr_00;
  st_h2o_logger_t *__ptr_01;
  h2o_logger_t *e_2;
  size_t i_2;
  h2o_filter_t *e_1;
  size_t i_1;
  h2o_handler_t *e;
  size_t i;
  h2o_pathconf_t *pathconf_local;
  
  for (e = (h2o_handler_t *)0x0; e != (h2o_handler_t *)(pathconf->handlers).size;
      e = (h2o_handler_t *)((long)&e->_config_slot + 1)) {
    __ptr = (pathconf->handlers).entries[(long)e];
    if (__ptr->dispose != (_func_void_st_h2o_handler_t_ptr *)0x0) {
      (*__ptr->dispose)(__ptr);
    }
    free(__ptr);
  }
  free((pathconf->handlers).entries);
  for (e_1 = (h2o_filter_t *)0x0; e_1 != (h2o_filter_t *)(pathconf->filters).size;
      e_1 = (h2o_filter_t *)((long)&e_1->_config_slot + 1)) {
    __ptr_00 = (pathconf->filters).entries[(long)e_1];
    if (__ptr_00->dispose != (_func_void_st_h2o_filter_t_ptr *)0x0) {
      (*__ptr_00->dispose)(__ptr_00);
    }
    free(__ptr_00);
  }
  free((pathconf->filters).entries);
  for (e_2 = (h2o_logger_t *)0x0; e_2 != (h2o_logger_t *)(pathconf->loggers).size;
      e_2 = (h2o_logger_t *)((long)&e_2->_config_slot + 1)) {
    __ptr_01 = (pathconf->loggers).entries[(long)e_2];
    if (__ptr_01->dispose != (_func_void_st_h2o_logger_t_ptr *)0x0) {
      (*__ptr_01->dispose)(__ptr_01);
    }
    free(__ptr_01);
  }
  free((pathconf->loggers).entries);
  free((pathconf->path).base);
  if (pathconf->mimemap != (h2o_mimemap_t *)0x0) {
    h2o_mem_release_shared(pathconf->mimemap);
  }
  if (pathconf->env != (h2o_envconf_t *)0x0) {
    h2o_mem_release_shared(pathconf->env);
  }
  return;
}

Assistant:

void h2o_config_dispose_pathconf(h2o_pathconf_t *pathconf)
{
#define DESTROY_LIST(type, list)                                                                                                   \
    do {                                                                                                                           \
        size_t i;                                                                                                                  \
        for (i = 0; i != list.size; ++i) {                                                                                         \
            type *e = list.entries[i];                                                                                             \
            if (e->dispose != NULL)                                                                                                \
                e->dispose(e);                                                                                                     \
            free(e);                                                                                                               \
        }                                                                                                                          \
        free(list.entries);                                                                                                        \
    } while (0)
    DESTROY_LIST(h2o_handler_t, pathconf->handlers);
    DESTROY_LIST(h2o_filter_t, pathconf->filters);
    DESTROY_LIST(h2o_logger_t, pathconf->loggers);
#undef DESTROY_LIST

    free(pathconf->path.base);
    if (pathconf->mimemap != NULL)
        h2o_mem_release_shared(pathconf->mimemap);
    if (pathconf->env != NULL)
        h2o_mem_release_shared(pathconf->env);
}